

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O3

int set_flag(char pram)

{
  vm_register *pvVar1;
  
  pvVar1 = registe_ptr;
  if (pram == '\0') {
    registe_ptr->flag[0] = '\0';
  }
  else {
    registe_ptr->flag[0] = '\x01';
    if (pram < '\x01') {
      pvVar1->flag[1] = '\0';
    }
    else {
      pvVar1->flag[1] = '\x01';
    }
  }
  return 1;
}

Assistant:

int set_flag(char pram) {
	char * ptr = registe_ptr->flag;//获取flag指针
	if(pram== 0){
		ptr[0] = 0;
		return LVM_SUCCESS;
	}
	else if (pram > 0) {
		ptr[0] = 1;
		ptr[1] = 1;
		return LVM_SUCCESS;
	}else if(pram<0)
	{
		ptr[0] = 1;
		ptr[1] = 0;
		return LVM_SUCCESS;
	}
	return LVM_FAILD;
}